

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RandJoinClauseSyntax::setChild
          (RandJoinClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 uVar1;
  SyntaxNode *pSVar2;
  ParenthesizedExpressionSyntax *pPVar3;
  logic_error *this_00;
  Token TVar4;
  long lStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (index == 2) {
    pSVar2 = TokenOrSyntax::node(&child);
    lStack_f0 = 0x30;
    if (pSVar2 == (SyntaxNode *)0x0) {
      pPVar3 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node(&child);
      pPVar3 = SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>(pSVar2);
    }
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pPVar3 = (ParenthesizedExpressionSyntax *)TVar4.info;
    uVar1 = TVar4._0_8_;
    (this->join).kind = (short)uVar1;
    (this->join).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->join).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->join).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_f0 = 0x28;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_e1);
      std::operator+(&local_a0,&local_c0,":");
      std::__cxx11::to_string(&local_e0,0x2aaf);
      std::operator+(&local_80,&local_a0,&local_e0);
      std::operator+(&local_60,&local_80,": ");
      std::operator+(&local_40,&local_60,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pPVar3 = (ParenthesizedExpressionSyntax *)TVar4.info;
    uVar1 = TVar4._0_8_;
    (this->rand).kind = (short)uVar1;
    (this->rand).field_0x2 = (char)((ulong)uVar1 >> 0x10);
    (this->rand).numFlags = (NumericTokenFlags)(char)((ulong)uVar1 >> 0x18);
    (this->rand).rawLen = (int)((ulong)uVar1 >> 0x20);
    lStack_f0 = 0x18;
  }
  *(ParenthesizedExpressionSyntax **)((long)&(this->super_SyntaxNode).parent + lStack_f0) = pPVar3;
  return;
}

Assistant:

void RandJoinClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: rand = child.token(); return;
        case 1: join = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}